

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link_varyings.cpp
# Opt level: O3

bool __thiscall
tfeedback_decl::assign_location(tfeedback_decl *this,gl_context *ctx,gl_shader_program *prog)

{
  ulong uVar1;
  char cVar2;
  anon_enum_32 aVar3;
  uint uVar4;
  tfeedback_candidate *ptVar5;
  glsl_type *pgVar6;
  undefined1 auVar7 [15];
  undefined1 auVar8 [14];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [14];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  unkuint9 Var17;
  undefined1 auVar18 [11];
  undefined1 auVar19 [13];
  undefined1 auVar20 [14];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  GLenum GVar23;
  uint uVar24;
  ir_variable *piVar25;
  byte bVar26;
  glsl_type *pgVar27;
  uint uVar28;
  uint uVar29;
  uint uVar31;
  uint uVar32;
  int iVar33;
  ulong uVar30;
  
  if ((this->next_buffer_separator != false) || (this->skip_components != 0)) {
    __assert_fail("this->is_varying()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/link_varyings.cpp"
                  ,0x418,
                  "bool tfeedback_decl::assign_location(struct gl_context *, struct gl_shader_program *)"
                 );
  }
  ptVar5 = this->matched_candidate;
  piVar25 = ptVar5->toplevel_var;
  pgVar27 = ptVar5->type;
  uVar24 = ptVar5->offset;
  pgVar6 = pgVar27;
  cVar2 = pgVar27->field_0x4;
  while (cVar2 == '\x11') {
    pgVar6 = (pgVar6->fields).array;
    cVar2 = pgVar6->field_0x4;
  }
  bVar26 = 0;
  if ((byte)(cVar2 - 4U) < 10) {
    bVar26 = (byte)*(undefined4 *)(&DAT_00228ba4 + (ulong)(byte)(cVar2 - 4U) * 4);
  }
  uVar29 = uVar24 + (piVar25->data).location * 4 + (*(uint *)&piVar25->data >> 0x1d & 3);
  uVar30 = (ulong)uVar29;
  if (pgVar27->field_0x4 == '\x11') {
    aVar3 = this->lowered_builtin_array_variable;
    switch(aVar3) {
    case clip_distance:
      if (prog->last_vert_prog == (gl_program *)0x0) goto LAB_001e943c;
      uVar28 = *(uint *)&(prog->last_vert_prog->info).field_0x76;
LAB_001e9430:
      uVar28 = uVar28 & 0xf;
      break;
    case cull_distance:
      if (prog->last_vert_prog != (gl_program *)0x0) {
        uVar28 = *(uint *)&(prog->last_vert_prog->info).field_0x76 >> 4;
        goto LAB_001e9430;
      }
LAB_001e943c:
      uVar28 = 0;
      break;
    case tess_level_outer:
      uVar28 = 4;
      break;
    case tess_level_inner:
      uVar28 = 2;
      break;
    default:
      uVar28 = pgVar27->length;
    }
    uVar32 = (uint)((pgVar27->fields).array)->vector_elements;
    uVar31 = (uint)((pgVar27->fields).array)->matrix_columns;
    if (this->is_subscripted == true) {
      uVar4 = this->array_subscript;
      if (uVar28 <= uVar4) {
        linker_error(prog,"Transform feedback varying %s has index %i, but the array size is %u.",
                     this->orig_name,(ulong)uVar4);
        return false;
      }
      iVar33 = uVar32 * uVar31 << (bVar26 & 0x1f);
      uVar28 = 1;
      if (aVar3 != none) {
        iVar33 = 1;
      }
      uVar30 = (ulong)(uVar29 + uVar4 * iVar33);
    }
    this->size = uVar28;
    this->vector_elements = uVar32;
    this->matrix_columns = uVar31;
    GVar23 = 0x1406;
    if (aVar3 != none) goto LAB_001e9497;
    pgVar27 = (pgVar27->fields).array;
  }
  else {
    if (this->is_subscripted == true) {
      linker_error(prog,"Transform feedback varying %s requested, but %s is not an array.",
                   this->orig_name,this->var_name);
      return false;
    }
    this->size = 1;
    uVar1._0_1_ = pgVar27->vector_elements;
    uVar1._1_1_ = pgVar27->matrix_columns;
    uVar1._2_2_ = *(undefined2 *)&pgVar27->field_0xa;
    uVar1._4_4_ = pgVar27->length;
    auVar7._8_6_ = 0;
    auVar7._0_8_ = uVar1;
    auVar7[0xe] = (char)((uint)uVar1._4_4_ >> 0x18);
    auVar9._8_4_ = 0;
    auVar9._0_8_ = uVar1;
    auVar9[0xc] = (char)((uint)uVar1._4_4_ >> 0x10);
    auVar9._13_2_ = auVar7._13_2_;
    auVar10._8_4_ = 0;
    auVar10._0_8_ = uVar1;
    auVar10._12_3_ = auVar9._12_3_;
    auVar11._8_2_ = 0;
    auVar11._0_8_ = uVar1;
    auVar11[10] = (char)((uint)uVar1._4_4_ >> 8);
    auVar11._11_4_ = auVar10._11_4_;
    auVar12._8_2_ = 0;
    auVar12._0_8_ = uVar1;
    auVar12._10_5_ = auVar11._10_5_;
    auVar14[8] = (char)uVar1._4_4_;
    auVar14._0_8_ = uVar1;
    auVar14._9_6_ = auVar12._9_6_;
    auVar16._7_8_ = 0;
    auVar16._0_7_ = auVar14._8_7_;
    Var17 = CONCAT81(SUB158(auVar16 << 0x40,7),(char)((ushort)uVar1._2_2_ >> 8));
    auVar21._9_6_ = 0;
    auVar21._0_9_ = Var17;
    auVar18._1_10_ = SUB1510(auVar21 << 0x30,5);
    auVar18[0] = (char)uVar1._2_2_;
    auVar22._11_4_ = 0;
    auVar22._0_11_ = auVar18;
    auVar19._1_12_ = SUB1512(auVar22 << 0x20,3);
    auVar19[0] = uVar1._1_1_;
    auVar15._2_13_ = auVar19;
    auVar15._0_2_ = CONCAT11(0,(undefined1)uVar1);
    auVar8._10_2_ = 0;
    auVar8._0_10_ = auVar15._0_10_;
    auVar8._12_2_ = (short)Var17;
    auVar20._2_4_ = auVar8._10_4_;
    auVar20._0_2_ = auVar18._0_2_;
    auVar20._6_8_ = 0;
    auVar13._6_8_ = SUB148(auVar20 << 0x40,6);
    auVar13._4_2_ = auVar19._0_2_;
    auVar13._2_2_ = 0;
    auVar13._0_2_ = CONCAT11(0,(undefined1)uVar1);
    this->vector_elements = (int)auVar13._0_8_;
    this->matrix_columns = (int)((ulong)auVar13._0_8_ >> 0x20);
  }
  GVar23 = pgVar27->gl_type;
LAB_001e9497:
  this->type = GVar23;
  this->location = (int)(uVar30 >> 2);
  this->location_frac = (uint)uVar30 & 3;
  if ((prog->TransformFeedback).BufferMode == 0x8c8d) {
    uVar24 = num_components(this);
    if ((ctx->Const).MaxTransformFeedbackSeparateComponents < uVar24) {
      linker_error(prog,
                   "Transform feedback varying %s exceeds MAX_TRANSFORM_FEEDBACK_SEPARATE_COMPONENTS."
                   ,this->orig_name);
      return false;
    }
    piVar25 = this->matched_candidate->toplevel_var;
    uVar24 = this->matched_candidate->offset;
  }
  this->stream_id = (piVar25->data).stream;
  this->buffer = (piVar25->data).xfb_buffer;
  this->offset = ((uVar24 + this->array_subscript) * 4 << (bVar26 & 0x1f)) + (piVar25->data).offset;
  return true;
}

Assistant:

bool
tfeedback_decl::assign_location(struct gl_context *ctx,
                                struct gl_shader_program *prog)
{
   assert(this->is_varying());

   unsigned fine_location
      = this->matched_candidate->toplevel_var->data.location * 4
      + this->matched_candidate->toplevel_var->data.location_frac
      + this->matched_candidate->offset;
   const unsigned dmul =
      this->matched_candidate->type->without_array()->is_64bit() ? 2 : 1;

   if (this->matched_candidate->type->is_array()) {
      /* Array variable */
      const unsigned matrix_cols =
         this->matched_candidate->type->fields.array->matrix_columns;
      const unsigned vector_elements =
         this->matched_candidate->type->fields.array->vector_elements;
      unsigned actual_array_size;
      switch (this->lowered_builtin_array_variable) {
      case clip_distance:
         actual_array_size = prog->last_vert_prog ?
            prog->last_vert_prog->info.clip_distance_array_size : 0;
         break;
      case cull_distance:
         actual_array_size = prog->last_vert_prog ?
            prog->last_vert_prog->info.cull_distance_array_size : 0;
         break;
      case tess_level_outer:
         actual_array_size = 4;
         break;
      case tess_level_inner:
         actual_array_size = 2;
         break;
      case none:
      default:
         actual_array_size = this->matched_candidate->type->array_size();
         break;
      }

      if (this->is_subscripted) {
         /* Check array bounds. */
         if (this->array_subscript >= actual_array_size) {
            linker_error(prog, "Transform feedback varying %s has index "
                         "%i, but the array size is %u.",
                         this->orig_name, this->array_subscript,
                         actual_array_size);
            return false;
         }
         unsigned array_elem_size = this->lowered_builtin_array_variable ?
            1 : vector_elements * matrix_cols * dmul;
         fine_location += array_elem_size * this->array_subscript;
         this->size = 1;
      } else {
         this->size = actual_array_size;
      }
      this->vector_elements = vector_elements;
      this->matrix_columns = matrix_cols;
      if (this->lowered_builtin_array_variable)
         this->type = GL_FLOAT;
      else
         this->type = this->matched_candidate->type->fields.array->gl_type;
   } else {
      /* Regular variable (scalar, vector, or matrix) */
      if (this->is_subscripted) {
         linker_error(prog, "Transform feedback varying %s requested, "
                      "but %s is not an array.",
                      this->orig_name, this->var_name);
         return false;
      }
      this->size = 1;
      this->vector_elements = this->matched_candidate->type->vector_elements;
      this->matrix_columns = this->matched_candidate->type->matrix_columns;
      this->type = this->matched_candidate->type->gl_type;
   }
   this->location = fine_location / 4;
   this->location_frac = fine_location % 4;

   /* From GL_EXT_transform_feedback:
    *   A program will fail to link if:
    *
    *   * the total number of components to capture in any varying
    *     variable in <varyings> is greater than the constant
    *     MAX_TRANSFORM_FEEDBACK_SEPARATE_COMPONENTS_EXT and the
    *     buffer mode is SEPARATE_ATTRIBS_EXT;
    */
   if (prog->TransformFeedback.BufferMode == GL_SEPARATE_ATTRIBS &&
       this->num_components() >
       ctx->Const.MaxTransformFeedbackSeparateComponents) {
      linker_error(prog, "Transform feedback varying %s exceeds "
                   "MAX_TRANSFORM_FEEDBACK_SEPARATE_COMPONENTS.",
                   this->orig_name);
      return false;
   }

   /* Only transform feedback varyings can be assigned to non-zero streams,
    * so assign the stream id here.
    */
   this->stream_id = this->matched_candidate->toplevel_var->data.stream;

   unsigned array_offset = this->array_subscript * 4 * dmul;
   unsigned struct_offset = this->matched_candidate->offset * 4 * dmul;
   this->buffer = this->matched_candidate->toplevel_var->data.xfb_buffer;
   this->offset = this->matched_candidate->toplevel_var->data.offset +
      array_offset + struct_offset;

   return true;
}